

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid.cpp
# Opt level: O0

bool libtorrent::aux::anon_unknown_0::supports_arm_neon(void)

{
  return false;
}

Assistant:

bool supports_arm_neon() noexcept
	{
#if TORRENT_HAS_ARM_NEON && TORRENT_HAS_AUXV
#if defined __arm__
		//return (getauxval(AT_HWCAP) & HWCAP_NEON);
		return (helper_getauxval(16) & (1 << 12));
#elif defined __aarch64__
		//return (getauxval(AT_HWCAP) & HWCAP_ASIMD);
		//return (getauxval(16) & (1 << 1));
		// TODO: enable when aarch64 is really tested
		return false;
#endif
#else
		return false;
#endif
	}